

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O2

void duckdb::BinaryExecutor::
     ExecuteGenericLoop<duckdb::string_t,duckdb::string_t,bool,duckdb::BinaryStandardOperatorWrapper,duckdb::PrefixOperator,bool>
               (string_t *ldata,string_t *rdata,bool *result_data,SelectionVector *lsel,
               SelectionVector *rsel,idx_t count,ValidityMask *lvalidity,ValidityMask *rvalidity,
               ValidityMask *result_validity,bool fun)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  idx_t i_1;
  idx_t row_idx;
  idx_t i;
  ulong uVar4;
  idx_t row_idx_00;
  idx_t row_idx_01;
  string_t left;
  string_t left_00;
  string_t right;
  string_t right_00;
  
  if ((rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0
      && (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
         (unsigned_long *)0x0) {
    for (uVar4 = 0; count != uVar4; uVar4 = uVar4 + 1) {
      uVar2 = uVar4;
      if (lsel->sel_vector != (sel_t *)0x0) {
        uVar2 = (ulong)lsel->sel_vector[uVar4];
      }
      uVar3 = uVar4;
      if (rsel->sel_vector != (sel_t *)0x0) {
        uVar3 = (ulong)rsel->sel_vector[uVar4];
      }
      left.value.pointer.ptr = ldata[uVar2].value.pointer.ptr;
      left.value._0_8_ = *(undefined8 *)&ldata[uVar2].value;
      right.value.pointer.ptr = rdata[uVar3].value.pointer.ptr;
      right.value._0_8_ = *(undefined8 *)&rdata[uVar3].value;
      bVar1 = PrefixOperator::Operation<duckdb::string_t,duckdb::string_t,bool>(left,right);
      result_data[uVar4] = bVar1;
    }
  }
  else {
    for (row_idx = 0; count != row_idx; row_idx = row_idx + 1) {
      row_idx_00 = row_idx;
      if (lsel->sel_vector != (sel_t *)0x0) {
        row_idx_00 = (idx_t)lsel->sel_vector[row_idx];
      }
      row_idx_01 = row_idx;
      if (rsel->sel_vector != (sel_t *)0x0) {
        row_idx_01 = (idx_t)rsel->sel_vector[row_idx];
      }
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (&lvalidity->super_TemplatedValidityMask<unsigned_long>,row_idx_00);
      if (bVar1) {
        bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (&rvalidity->super_TemplatedValidityMask<unsigned_long>,row_idx_01);
        if (!bVar1) goto LAB_01866419;
        left_00.value.pointer.ptr = ldata[row_idx_00].value.pointer.ptr;
        left_00.value._0_8_ = *(undefined8 *)&ldata[row_idx_00].value;
        right_00.value.pointer.ptr = rdata[row_idx_01].value.pointer.ptr;
        right_00.value._0_8_ = *(undefined8 *)&rdata[row_idx_01].value;
        bVar1 = PrefixOperator::Operation<duckdb::string_t,duckdb::string_t,bool>(left_00,right_00);
        result_data[row_idx] = bVar1;
      }
      else {
LAB_01866419:
        TemplatedValidityMask<unsigned_long>::SetInvalid
                  (&result_validity->super_TemplatedValidityMask<unsigned_long>,row_idx);
      }
    }
  }
  return;
}

Assistant:

static void ExecuteGenericLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                               RESULT_TYPE *__restrict result_data, const SelectionVector *__restrict lsel,
	                               const SelectionVector *__restrict rsel, idx_t count, ValidityMask &lvalidity,
	                               ValidityMask &rvalidity, ValidityMask &result_validity, FUNC fun) {
		if (!lvalidity.AllValid() || !rvalidity.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto lindex = lsel->get_index(i);
				auto rindex = rsel->get_index(i);
				if (lvalidity.RowIsValid(lindex) && rvalidity.RowIsValid(rindex)) {
					auto lentry = ldata[lindex];
					auto rentry = rdata[rindex];
					result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
					    fun, lentry, rentry, result_validity, i);
				} else {
					result_validity.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[lsel->get_index(i)];
				auto rentry = rdata[rsel->get_index(i)];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, result_validity, i);
			}
		}
	}